

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O1

void aes_ecb(uchar *out,uchar *in,size_t nblocks,uint64_t *rkeys,uint nrounds)

{
  long lVar1;
  uint32_t blocks [16];
  uchar t [64];
  uint32_t local_b8 [16];
  uchar local_78 [72];
  
  if (3 < nblocks) {
    do {
      lVar1 = 0;
      do {
        local_b8[lVar1] = *(uint32_t *)(in + lVar1 * 4);
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0x10);
      aes_ecb4x(out,local_b8,rkeys,nrounds);
      nblocks = nblocks - 4;
      in = in + 0x40;
      out = out + 0x40;
    } while (3 < nblocks);
  }
  if (nblocks != 0) {
    lVar1 = 0;
    do {
      local_b8[lVar1] = *(uint32_t *)(in + lVar1 * 4);
      lVar1 = lVar1 + 1;
    } while (nblocks * 4 - lVar1 != 0);
    aes_ecb4x(local_78,local_b8,rkeys,nrounds);
    memcpy(out,local_78,nblocks << 4);
  }
  return;
}

Assistant:

static void aes_ecb(unsigned char *out, const unsigned char *in, size_t nblocks, const uint64_t *rkeys, unsigned int nrounds) {
    uint32_t blocks[16];
    unsigned char t[64];

    while (nblocks >= 4) {
        br_range_dec32le(blocks, 16, in);
        aes_ecb4x(out, blocks, rkeys, nrounds);
        nblocks -= 4;
        in += 64;
        out += 64;
    }

    if (nblocks) {
        br_range_dec32le(blocks, nblocks * 4, in);
        aes_ecb4x(t, blocks, rkeys, nrounds);
        memcpy(out, t, nblocks * 16);
    }
}